

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool __thiscall common_arg::get_value_from_env(common_arg *this,string *output)

{
  char *pcVar1;
  string *in_RSI;
  long in_RDI;
  char *value;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    local_1 = false;
  }
  else {
    pcVar1 = getenv(*(char **)(in_RDI + 0x88));
    if (pcVar1 == (char *)0x0) {
      local_1 = false;
    }
    else {
      std::__cxx11::string::operator=(in_RSI,pcVar1);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool common_arg::get_value_from_env(std::string & output) {
    if (env == nullptr) return false;
    char * value = std::getenv(env);
    if (value) {
        output = value;
        return true;
    }
    return false;
}